

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safecrt.h
# Opt level: O2

errno_t strncpy_s(char *_Dst,size_t _SizeInBytes,char *_Src,size_t _Count)

{
  char cVar1;
  long lVar2;
  size_t __n;
  ulong uVar3;
  char *__s;
  size_t sVar4;
  
  if ((_Count == 0 && _SizeInBytes == 0) && _Dst == (char *)0x0) {
    return 0;
  }
  if (_Dst == (char *)0x0 || _SizeInBytes == 0) {
LAB_0060b3e1:
    RaiseException(0xc000000d,0,0,(ULONG_PTR *)0x0);
    return 0x16;
  }
  if (_Count == 0) {
    *_Dst = '\0';
    if (_SizeInBytes < 2) {
      return 0;
    }
    __s = _Dst + 1;
    __n = _SizeInBytes - 1;
    goto LAB_0060b4e3;
  }
  if (_Src == (char *)0x0) {
    *_Dst = '\0';
    if (1 < _SizeInBytes) {
      memset(_Dst + 1,0xfd,_SizeInBytes - 1);
    }
    goto LAB_0060b3e1;
  }
  if (_Count == 0xffffffffffffffff) {
    sVar4 = 0;
    do {
      cVar1 = _Src[sVar4];
      _Dst[sVar4] = cVar1;
      if (cVar1 == '\0') goto LAB_0060b4c8;
      sVar4 = sVar4 + 1;
    } while (_SizeInBytes != sVar4);
LAB_0060b48f:
    if (_Count != 0xffffffffffffffff) {
      *_Dst = '\0';
      if (1 < _SizeInBytes) {
        memset(_Dst + 1,0xfd,_SizeInBytes - 1);
      }
      RaiseException(0xc000000d,0,0,(ULONG_PTR *)0x0);
      return 0x22;
    }
    _Dst[_SizeInBytes - 1] = '\0';
    return 0x50;
  }
  lVar2 = -_Count;
  sVar4 = 0;
  do {
    cVar1 = _Src[sVar4];
    _Dst[sVar4] = cVar1;
    if (cVar1 == '\0') goto LAB_0060b4c8;
    if (_SizeInBytes - 1 == sVar4) goto LAB_0060b48f;
    sVar4 = sVar4 + 1;
  } while (_Count != sVar4);
  _Dst[sVar4] = '\0';
LAB_0060b4ce:
  uVar3 = 1 - lVar2;
  __n = _SizeInBytes - uVar3;
  if (_SizeInBytes < uVar3 || __n == 0) {
    return 0;
  }
  __s = _Dst + uVar3;
LAB_0060b4e3:
  memset(__s,0xfd,__n);
  return 0;
LAB_0060b4c8:
  lVar2 = -sVar4;
  goto LAB_0060b4ce;
}

Assistant:

_SAFECRT__INLINE
errno_t __cdecl strncpy_s(char *_Dst, size_t _SizeInBytes, const char *_Src, size_t _Count)
{
    char *p;
    size_t available;

    if (_Count == 0 && _Dst == nullptr && _SizeInBytes == 0)
    {
        /* this case is allowed; nothing to do */
        return 0;
    }

    /* validation section */
    _SAFECRT__VALIDATE_STRING(_Dst, _SizeInBytes);
    if (_Count == 0)
    {
        /* notice that the source string pointer can be nullptr in this case */
        _SAFECRT__RESET_STRING(_Dst, _SizeInBytes);
        return 0;
    }
    _SAFECRT__VALIDATE_POINTER_RESET_STRING(_Src, _Dst, _SizeInBytes);

    p = _Dst;
    available = _SizeInBytes;
    if (_Count == _TRUNCATE)
    {
        while ((*p++ = *_Src++) != 0 && --available > 0)
        {
        }
    }
    else
    {
        while ((*p++ = *_Src++) != 0 && --available > 0 && --_Count > 0)
        {
        }
        if (_Count == 0)
        {
            *p = 0;
        }
    }

    if (available == 0)
    {
        if (_Count == _TRUNCATE)
        {
            _Dst[_SizeInBytes - 1] = 0;
            return STRUNCATE;
        }
        _SAFECRT__RESET_STRING(_Dst, _SizeInBytes);
        _SAFECRT__RETURN_BUFFER_TOO_SMALL(_Dst, _SizeInBytes);
    }
    _SAFECRT__FILL_STRING(_Dst, _SizeInBytes, _SizeInBytes - available + 1);
    return 0;
}